

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_>::Clone
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_> *this)

{
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_> *this_00;
  
  this_00 = (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOT<double>_> *)
            operator_new(0x158);
  TPZFrontStructMatrix(this_00,this);
  return (TPZStructMatrix *)this_00;
}

Assistant:

TPZStructMatrix * TPZFrontStructMatrix<TFront,TVar,TPar>::Clone(){
	
	auto* result =  new TPZFrontStructMatrix<TFront,TVar,TPar>(*this);
	return result;
}